

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk44(envy_bios *bios)

{
  uint offs;
  int iVar1;
  
  offs = (bios->power).unk44.offset;
  iVar1 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk44.version);
    if ((bios->power).unk44.version == '\x10') {
      iVar1 = bios_u8(bios,(bios->power).unk44.offset + 1,&(bios->power).unk44.hlen);
      (bios->power).unk44.valid = iVar1 == 0;
      iVar1 = 0;
    }
    else {
      fprintf(_stderr,"Unknown PERF TEST SPEC table version 0x%x\n");
    }
  }
  return iVar1;
}

Assistant:

int envy_bios_parse_power_unk44(struct envy_bios *bios) {
	struct envy_bios_power_unk44 *unk44 = &bios->power.unk44;
	int err = 0;

	if (!unk44->offset)
		return -EINVAL;

	bios_u8(bios, unk44->offset + 0x0, &unk44->version);
	switch(unk44->version) {
	case 0x10:
		err |= bios_u8(bios, unk44->offset + 0x1, &unk44->hlen);

		/* it doesn't appear as if this table has entries at all */
		unk44->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown PERF TEST SPEC table version 0x%x\n", unk44->version);
		return -EINVAL;
	};

	return 0;
}